

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmpolicytctocsv.cpp
# Opt level: O0

void fmpolicytctocsv::doit(bool skipheader)

{
  size_t local_28;
  size_t i;
  uint local_15;
  fm_policyTC q;
  bool skipheader_local;
  
  q.layer_id._0_1_ = skipheader;
  if (!skipheader) {
    printf("layer_id,level_id,agg_id,profile_id\n");
  }
  local_28 = fread((void *)((long)&i + 7),0x10,1,_stdin);
  while (local_28 != 0) {
    printf(" %d, %d, %d, %d\n",(ulong)(uint)q.level_id,(ulong)stack0xffffffffffffffe7,
           (ulong)local_15,(ulong)(uint)q.agg_id);
    local_28 = fread((void *)((long)&i + 7),0x10,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool skipheader)
	{

		if (skipheader == false)  printf("layer_id,level_id,agg_id,profile_id\n");

		fm_policyTC q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf(" %d, %d, %d, %d\n", q.layer_id, q.level_id, q.agg_id, q.profile_id);
			i = fread(&q, sizeof(q), 1, stdin);
		}
	}